

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

void __thiscall pg::PTLSolver::PTLSolver(PTLSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  undefined1 auVar4 [32];
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PTLSolver_001a7b68;
  this->multiplayer = true;
  (this->SolvedQ0).pointer = 0;
  (this->SolvedQ0).queue = (uint *)0x0;
  (this->SolvedQ1).pointer = 0;
  (this->SolvedQ1).queue = (uint *)0x0;
  (this->Zvec).pointer = 0;
  (this->Zvec).queue = (uint *)0x0;
  (this->pea_vS).pointer = 0;
  (this->pea_vS).queue = (uint *)0x0;
  (this->pea_iS).pointer = 0;
  (this->pea_iS).queue = (uint *)0x0;
  (this->pea_S).pointer = 0;
  (this->pea_S).queue = (uint *)0x0;
  this->pea_root = (bitset)ZEXT1632(auVar1);
  *(undefined1 (*) [32])&this->iterations = ZEXT1632(auVar1);
  *(undefined4 *)
   ((long)&(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  auVar2 = ZEXT1632(auVar1);
  this->tv = (vector<int_*,_std::allocator<int_*>_>)auVar2._0_24_;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = auVar2;
  this->tangle = (vector<int,_std::allocator<int>_>)auVar2._0_24_;
  (this->tangleto).queue = (uint *)auVar2._24_8_;
  auVar3 = ZEXT464(0) << 0x40;
  (this->tangleto).pointer = 0;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->S0)._bits = (uint64_t *)auVar2._0_8_;
  (this->S0)._size = auVar2._8_8_;
  (this->S0)._bitssize = auVar2._16_8_;
  (this->S0)._allocsize = auVar2._24_8_;
  (this->S1)._bits = (uint64_t *)auVar4._0_8_;
  (this->S1)._size = auVar4._8_8_;
  (this->S1)._bitssize = auVar4._16_8_;
  (this->S1)._allocsize = auVar4._24_8_;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->G)._bits = (uint64_t *)auVar2._0_8_;
  (this->G)._size = auVar2._8_8_;
  (this->G)._bitssize = auVar2._16_8_;
  (this->G)._allocsize = auVar2._24_8_;
  (this->S0)._bits = (uint64_t *)auVar4._0_8_;
  (this->S0)._size = auVar4._8_8_;
  (this->S0)._bitssize = auVar4._16_8_;
  (this->S0)._allocsize = auVar4._24_8_;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->bs_exits)._bits = (uint64_t *)auVar2._0_8_;
  (this->bs_exits)._size = auVar2._8_8_;
  (this->bs_exits)._bitssize = auVar2._16_8_;
  (this->bs_exits)._allocsize = auVar2._24_8_;
  (this->H)._bits = (uint64_t *)auVar4._0_8_;
  (this->H)._size = auVar4._8_8_;
  (this->H)._bitssize = auVar4._16_8_;
  (this->H)._allocsize = auVar4._24_8_;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PTLSolver::PTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}